

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

LY_ERR ly_ctx_set_searchdir(ly_ctx *ctx,char *search_dir)

{
  byte *pbVar1;
  lyd_node **pplVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  bool bVar5;
  int iVar6;
  LY_ERR LVar7;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  void *pvVar15;
  LY_ERR LVar16;
  stat st;
  stat local_c0;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_set_searchdir");
    return LY_EINVAL;
  }
  bVar5 = true;
  if (search_dir == (char *)0x0) {
    LVar16 = LY_SUCCESS;
  }
  else {
    pcVar8 = realpath(search_dir,(char *)0x0);
    if (pcVar8 != (char *)0x0) {
      iVar6 = strcmp(search_dir,pcVar8);
      if (iVar6 != 0) {
        ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
               "Search directory string \"%s\" canonized to \"%s\".",search_dir,pcVar8);
      }
      iVar6 = access(pcVar8,5);
      if (iVar6 == 0) {
        iVar6 = stat(pcVar8,&local_c0);
        if (iVar6 != 0) {
          piVar9 = __errno_location();
          pcVar10 = strerror(*piVar9);
          bVar5 = false;
          LVar16 = LY_ESYS;
          ly_log(ctx,LY_LLERR,LY_ESYS,"stat() failed for \"%s\" (%s).",pcVar8,pcVar10);
          goto LAB_0011b45f;
        }
        if ((local_c0.st_mode & 0xf000) == 0x4000) {
          uVar11 = (ulong)(ctx->search_paths).count;
          if (uVar11 != 0) {
            pplVar2 = (ctx->search_paths).field_2.dnodes;
            uVar13 = 0;
            do {
              iVar6 = strcmp(pcVar8,(char *)pplVar2[uVar13]);
              if (iVar6 == 0) {
                LVar16 = LY_EEXIST;
                bVar5 = false;
                goto LAB_0011b45f;
              }
              uVar13 = uVar13 + 1;
            } while (uVar11 != uVar13);
          }
          LVar16 = LY_SUCCESS;
          LVar7 = ly_set_add(&ctx->search_paths,pcVar8,'\x01',(uint32_t *)0x0);
          if (LVar7 == LY_SUCCESS) {
            if ((ctx->list).count != 0) {
              uVar11 = 0;
              do {
                plVar3 = (ctx->list).field_2.dnodes[uVar11];
                pbVar1 = (byte *)((long)&plVar3[2].schema + 2);
                *pbVar1 = *pbVar1 & 0xfd;
                if ((plVar3[1].next != (lyd_node *)0x0) &&
                   ((plVar3[1].next)->next != (lyd_node *)0x0)) {
                  lVar12 = 0;
                  pvVar14 = (void *)0x0;
                  while( true ) {
                    plVar4 = (plVar3[1].next)->next;
                    if (plVar4 == (lyd_node *)0x0) {
                      pvVar15 = (void *)0x0;
                    }
                    else {
                      pvVar15 = plVar4[-1].priv;
                    }
                    if (pvVar15 <= pvVar14) break;
                    pbVar1 = (byte *)(*(long *)((long)&plVar4->hash + lVar12) + 0x79);
                    *pbVar1 = *pbVar1 & 0xf7;
                    pvVar14 = (void *)((long)pvVar14 + 1);
                    lVar12 = lVar12 + 0x38;
                  }
                }
                uVar11 = uVar11 + 1;
                LVar16 = LY_SUCCESS;
              } while (uVar11 < (ctx->list).count);
            }
          }
          else {
            bVar5 = false;
            LVar16 = LY_EMEM;
          }
          goto LAB_0011b45f;
        }
        ly_log(ctx,LY_LLERR,LY_ESYS,"Given search directory \"%s\" is not a directory.",pcVar8);
      }
      else {
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        ly_log(ctx,LY_LLERR,LY_ESYS,"Unable to fully access search directory \"%s\" (%s).",pcVar8,
               pcVar10);
      }
      bVar5 = false;
      LVar16 = LY_EINVAL;
      goto LAB_0011b45f;
    }
    piVar9 = __errno_location();
    pcVar8 = strerror(*piVar9);
    bVar5 = false;
    ly_log(ctx,LY_LLERR,LY_ESYS,"Unable to use search directory \"%s\" (%s).",search_dir,pcVar8);
    LVar16 = LY_EINVAL;
  }
  pcVar8 = (char *)0x0;
LAB_0011b45f:
  if (!bVar5) {
    free(pcVar8);
  }
  return LVar16;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_set_searchdir(struct ly_ctx *ctx, const char *search_dir)
{
    int rc = LY_SUCCESS;
    struct stat st;
    char *new_dir = NULL;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lys_module *mod;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    if (!search_dir) {
        /* fine, ignore */
        goto cleanup;
    }

    new_dir = realpath(search_dir, NULL);
    if (!new_dir) {
        LOGERR(ctx, LY_ESYS, "Unable to use search directory \"%s\" (%s).", search_dir, strerror(errno)),
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (strcmp(search_dir, new_dir)) {
        LOGVRB("Search directory string \"%s\" canonized to \"%s\".", search_dir, new_dir);
    }

    if (access(new_dir, R_OK | X_OK)) {
        LOGERR(ctx, LY_ESYS, "Unable to fully access search directory \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_EINVAL;
        goto cleanup;
    }
    if (stat(new_dir, &st)) {
        LOGERR(ctx, LY_ESYS, "stat() failed for \"%s\" (%s).", new_dir, strerror(errno));
        rc = LY_ESYS;
        goto cleanup;
    }
    if (!S_ISDIR(st.st_mode)) {
        LOGERR(ctx, LY_ESYS, "Given search directory \"%s\" is not a directory.", new_dir);
        rc = LY_EINVAL;
        goto cleanup;
    }

    /* avoid path duplication */
    for (i = 0; i < ctx->search_paths.count; ++i) {
        if (!strcmp(new_dir, ctx->search_paths.objs[i])) {
            rc = LY_EEXIST;
            goto cleanup;
        }
    }
    if (ly_set_add(&ctx->search_paths, new_dir, 1, NULL)) {
        rc = LY_EMEM;
        goto cleanup;
    }

    /* new searchdir - reset latests flags (possibly new revisions available) */
    for (i = 0; i < ctx->list.count; ++i) {
        mod = ctx->list.objs[i];

        mod->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
        if (mod->parsed && mod->parsed->includes) {
            for (u = 0; u < LY_ARRAY_COUNT(mod->parsed->includes); ++u) {
                mod->parsed->includes[u].submodule->latest_revision &= ~LYS_MOD_LATEST_SEARCHDIRS;
            }
        }
    }

cleanup:
    if (rc) {
        free(new_dir);
    }
    return rc;
}